

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::alloc
          (array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *this,int new_len)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  CScaledGlyph *pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  CScaledGlyph *pCVar12;
  long lVar13;
  ulong uVar14;
  
  this->list_size = new_len;
  uVar14 = 0xffffffffffffffff;
  if (-1 < new_len) {
    uVar14 = (long)new_len << 6;
  }
  pCVar12 = (CScaledGlyph *)operator_new__(uVar14);
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  if (0 < new_len) {
    pCVar3 = this->list;
    lVar13 = 0;
    do {
      puVar1 = (undefined8 *)((long)&pCVar3->m_pGlyph + lVar13);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      puVar1 = (undefined8 *)((long)&pCVar3->m_Line + lVar13);
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pCVar3->m_TextColor).field_1 + lVar13);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pCVar3->m_SecondaryColor).field_0 + lVar13);
      uVar10 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pCVar12->m_SecondaryColor).field_0 + lVar13);
      *puVar2 = *puVar1;
      puVar2[1] = uVar10;
      puVar1 = (undefined8 *)((long)&(pCVar12->m_TextColor).field_1 + lVar13);
      *puVar1 = uVar8;
      puVar1[1] = uVar9;
      puVar1 = (undefined8 *)((long)&pCVar12->m_Line + lVar13);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      puVar1 = (undefined8 *)((long)&pCVar12->m_pGlyph + lVar13);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      lVar13 = lVar13 + 0x40;
    } while ((ulong)(uint)new_len << 6 != lVar13);
  }
  if (this->list != (CScaledGlyph *)0x0) {
    operator_delete__(this->list);
  }
  iVar11 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar11 = this->num_elements;
  }
  this->num_elements = iVar11;
  this->list = pCVar12;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}